

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msatMem.c
# Opt level: O0

Msat_MmFixed_t * Msat_MmFixedStart(int nEntrySize)

{
  Msat_MmFixed_t *__s;
  char **ppcVar1;
  Msat_MmFixed_t *p;
  int nEntrySize_local;
  
  __s = (Msat_MmFixed_t *)malloc(0x38);
  memset(__s,0,0x38);
  __s->nEntrySize = nEntrySize;
  __s->nEntriesAlloc = 0;
  __s->nEntriesUsed = 0;
  __s->pEntriesFree = (char *)0x0;
  if (nEntrySize * 0x400 < 0x10000) {
    __s->nChunkSize = 0x400;
  }
  else {
    __s->nChunkSize = (int)(0x10000 / (long)nEntrySize);
  }
  if (__s->nChunkSize < 8) {
    __s->nChunkSize = 8;
  }
  __s->nChunksAlloc = 0x40;
  __s->nChunks = 0;
  ppcVar1 = (char **)malloc((long)__s->nChunksAlloc << 3);
  __s->pChunks = ppcVar1;
  __s->nMemoryUsed = 0;
  __s->nMemoryAlloc = 0;
  return __s;
}

Assistant:

Msat_MmFixed_t * Msat_MmFixedStart( int nEntrySize )
{
    Msat_MmFixed_t * p;

    p = ABC_ALLOC( Msat_MmFixed_t, 1 );
    memset( p, 0, sizeof(Msat_MmFixed_t) );

    p->nEntrySize    = nEntrySize;
    p->nEntriesAlloc = 0;
    p->nEntriesUsed  = 0;
    p->pEntriesFree  = NULL;

    if ( nEntrySize * (1 << 10) < (1<<16) )
        p->nChunkSize = (1 << 10);
    else
        p->nChunkSize = (1<<16) / nEntrySize;
    if ( p->nChunkSize < 8 )
        p->nChunkSize = 8;

    p->nChunksAlloc  = 64;
    p->nChunks       = 0;
    p->pChunks       = ABC_ALLOC( char *, p->nChunksAlloc );

    p->nMemoryUsed   = 0;
    p->nMemoryAlloc  = 0;
    return p;
}